

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall
btSoftBody::appendAngularJoint(btSoftBody *this,Specs *specs,Cluster *body0,Body body1)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  Joint **ptr;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  Joint *pJVar8;
  btTransform *pbVar9;
  Joint **ppJVar10;
  ulong uVar11;
  int iVar12;
  float local_78;
  float fStack_74;
  float fStack_70;
  float local_68;
  float local_64;
  float local_60;
  float local_58;
  float local_54;
  float local_50;
  
  pJVar8 = (Joint *)btAlignedAllocInternal(0xe0,0x10);
  memset(pJVar8->m_refs,0,0xa8);
  pJVar8->_vptr_Joint = (_func_int **)&PTR__Joint_002214b8;
  pJVar8->m_bodies[0].m_soft = body0;
  pJVar8->m_bodies[0].m_rigid = (btRigidBody *)0x0;
  pJVar8->m_bodies[0].m_collisionObject = (btCollisionObject *)0x0;
  pJVar8->m_bodies[1].m_soft = body1.m_soft;
  pJVar8->m_bodies[1].m_rigid = body1.m_rigid;
  pJVar8->m_bodies[1].m_collisionObject = body1.m_collisionObject;
  pbVar9 = Body::xform(pJVar8->m_bodies);
  btTransform::inverse(pbVar9);
  fVar1 = *(float *)(specs + 0xc);
  fVar2 = *(float *)(specs + 0x10);
  fVar3 = *(float *)(specs + 0x14);
  auVar5._4_4_ = fVar3 * local_60 + fVar1 * local_68 + local_64 * fVar2;
  auVar5._0_4_ = fVar3 * fStack_70 + fVar1 * local_78 + fStack_74 * fVar2;
  auVar5._8_4_ = fVar3 * local_50 + fVar1 * local_58 + fVar2 * local_54;
  auVar5._12_4_ = 0;
  *(undefined1 (*) [16])pJVar8->m_refs[0].m_floats = auVar5;
  pbVar9 = Body::xform(pJVar8->m_bodies + 1);
  btTransform::inverse(pbVar9);
  fVar1 = *(float *)(specs + 0xc);
  fVar2 = *(float *)(specs + 0x10);
  fVar3 = *(float *)(specs + 0x14);
  auVar6._4_4_ = fVar3 * local_60 + fVar1 * local_68 + local_64 * fVar2;
  auVar6._0_4_ = fVar3 * fStack_70 + fVar1 * local_78 + fStack_74 * fVar2;
  auVar6._8_4_ = fVar3 * local_50 + fVar1 * local_58 + fVar2 * local_54;
  auVar6._12_4_ = 0;
  *(undefined1 (*) [16])pJVar8->m_refs[1].m_floats = auVar6;
  uVar4 = *(undefined8 *)specs;
  pJVar8->m_cfm = (btScalar)(int)((ulong)uVar4 >> 0x20);
  pJVar8->m_erp = (btScalar)(int)uVar4;
  pJVar8->m_split = *(btScalar *)(specs + 8);
  pJVar8[1].m_bodies[1].m_soft = *(Cluster **)(specs + 0x20);
  uVar7 = (this->m_joints).m_size;
  if (uVar7 == (this->m_joints).m_capacity) {
    iVar12 = 1;
    if (uVar7 != 0) {
      iVar12 = uVar7 * 2;
    }
    if ((int)uVar7 < iVar12) {
      if (iVar12 == 0) {
        ppJVar10 = (Joint **)0x0;
      }
      else {
        ppJVar10 = (Joint **)btAlignedAllocInternal((long)iVar12 << 3,0x10);
        uVar7 = (this->m_joints).m_size;
      }
      if (0 < (int)uVar7) {
        uVar11 = 0;
        do {
          ppJVar10[uVar11] = (this->m_joints).m_data[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar7 != uVar11);
      }
      ptr = (this->m_joints).m_data;
      if ((ptr != (Joint **)0x0) && ((this->m_joints).m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr);
        uVar7 = (this->m_joints).m_size;
      }
      (this->m_joints).m_ownsMemory = true;
      (this->m_joints).m_data = ppJVar10;
      (this->m_joints).m_capacity = iVar12;
    }
  }
  (this->m_joints).m_data[(int)uVar7] = pJVar8;
  (this->m_joints).m_size = uVar7 + 1;
  return;
}

Assistant:

void			btSoftBody::appendAngularJoint(const AJoint::Specs& specs,Cluster* body0,Body body1)
{
	AJoint*		pj	=	new(btAlignedAlloc(sizeof(AJoint),16)) AJoint();
	pj->m_bodies[0]	=	body0;
	pj->m_bodies[1]	=	body1;
	pj->m_refs[0]	=	pj->m_bodies[0].xform().inverse().getBasis()*specs.axis;
	pj->m_refs[1]	=	pj->m_bodies[1].xform().inverse().getBasis()*specs.axis;
	pj->m_cfm		=	specs.cfm;
	pj->m_erp		=	specs.erp;
	pj->m_split		=	specs.split;
	pj->m_icontrol	=	specs.icontrol;
	m_joints.push_back(pj);
}